

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  _Base_ptr p_Var1;
  iterator __position;
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  *this_00;
  long lVar2;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  
  local_20 = field;
  this_00 = (vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
             *)std::
               map<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
               ::operator[](&this->nested_,&local_20);
  field_local = (FieldDescriptor *)operator_new(0x60);
  p_Var1 = (_Base_ptr)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 8);
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x20) = (_Base_ptr)0x0;
  *(size_t *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x28) = 0;
  *(undefined8 *)&(((ParseInfoTree *)field_local)->nested_)._M_t._M_impl = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 8))->_M_header = 0;
  *(undefined8 *)&(((ParseInfoTree *)field_local)->locations_)._M_t = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 8))->_M_header =
       0;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->locations_)._M_t + 0x20) = p_Var1;
  p_Var1 = (_Base_ptr)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 8);
  (((_Rb_tree_header *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 8))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 0x20) = p_Var1;
  *(size_t *)((long)&(((ParseInfoTree *)field_local)->nested_)._M_t + 0x28) = 0;
  __position._M_current =
       *(unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
         **)(this_00 + 8);
  if (__position._M_current ==
      *(unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
        **)(this_00 + 0x10)) {
    std::
    vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
    ::_M_realloc_insert<google::protobuf::TextFormat::ParseInfoTree*>
              (this_00,__position,(ParseInfoTree **)&field_local);
    lVar2 = *(long *)(this_00 + 8);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::TextFormat::ParseInfoTree_*,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
    .super__Head_base<0UL,_google::protobuf::TextFormat::ParseInfoTree_*,_false>._M_head_impl =
         (ParseInfoTree *)field_local;
    lVar2 = *(long *)(this_00 + 8) + 8;
    *(long *)(this_00 + 8) = lVar2;
  }
  return *(ParseInfoTree **)(lVar2 + -8);
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  auto& vec = nested_[field];
  vec.emplace_back(new TextFormat::ParseInfoTree());
  return vec.back().get();
}